

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompareNodeSetValue
              (xmlXPathParserContextPtr ctxt,int inf,int strict,xmlXPathObjectPtr arg,
              xmlXPathObjectPtr val)

{
  xmlNodeSetPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlXPathObjectPtr pxVar4;
  long lVar5;
  
  if ((arg->type | XPATH_USERS) != XPATH_XSLT_TREE) {
    return 0;
  }
  switch(val->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    iVar2 = xmlXPathCompareNodeSets(ctxt,inf,strict,arg,val);
    return iVar2;
  case XPATH_BOOLEAN:
    xmlXPathValuePush(ctxt,arg);
    xmlXPathBooleanFunction(ctxt,1);
    xmlXPathValuePush(ctxt,val);
    iVar2 = xmlXPathCompareValues(ctxt,inf,strict);
    return iVar2;
  case XPATH_NUMBER:
    pxVar1 = arg->nodesetval;
    iVar2 = 0;
    if ((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr < 1)) goto LAB_001c074c;
    lVar5 = 0;
    do {
      pxVar3 = xmlNodeGetContent(pxVar1->nodeTab[lVar5]);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      else {
        pxVar4 = xmlXPathCacheNewString(ctxt,pxVar3);
        xmlXPathValuePush(ctxt,pxVar4);
        (*xmlFree)(pxVar3);
        xmlXPathNumberFunction(ctxt,1);
        pxVar4 = xmlXPathCacheObjectCopy(ctxt,val);
        xmlXPathValuePush(ctxt,pxVar4);
        iVar2 = xmlXPathCompareValues(ctxt,inf,strict);
        if (iVar2 != 0) goto LAB_001c074c;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pxVar1->nodeNr);
    break;
  case XPATH_STRING:
    pxVar1 = arg->nodesetval;
    iVar2 = 0;
    if ((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr < 1)) goto LAB_001c074c;
    lVar5 = 0;
    do {
      pxVar3 = xmlNodeGetContent(pxVar1->nodeTab[lVar5]);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      else {
        pxVar4 = xmlXPathCacheNewString(ctxt,pxVar3);
        xmlXPathValuePush(ctxt,pxVar4);
        (*xmlFree)(pxVar3);
        pxVar4 = xmlXPathCacheObjectCopy(ctxt,val);
        xmlXPathValuePush(ctxt,pxVar4);
        iVar2 = xmlXPathCompareValues(ctxt,inf,strict);
        if (iVar2 != 0) goto LAB_001c074c;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pxVar1->nodeNr);
    break;
  default:
    xmlXPathReleaseObject(ctxt->context,arg);
    xmlXPathReleaseObject(ctxt->context,val);
    xmlXPathErr(ctxt,0xb);
    return 0;
  }
  iVar2 = 0;
LAB_001c074c:
  xmlXPathReleaseObject(ctxt->context,arg);
  xmlXPathReleaseObject(ctxt->context,val);
  return iVar2;
}

Assistant:

static int
xmlXPathCompareNodeSetValue(xmlXPathParserContextPtr ctxt, int inf, int strict,
	                    xmlXPathObjectPtr arg, xmlXPathObjectPtr val) {
    if ((val == NULL) || (arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE)))
        return(0);

    switch(val->type) {
        case XPATH_NUMBER:
	    return(xmlXPathCompareNodeSetFloat(ctxt, inf, strict, arg, val));
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    return(xmlXPathCompareNodeSets(ctxt, inf, strict, arg, val));
        case XPATH_STRING:
	    return(xmlXPathCompareNodeSetString(ctxt, inf, strict, arg, val));
        case XPATH_BOOLEAN:
	    xmlXPathValuePush(ctxt, arg);
	    xmlXPathBooleanFunction(ctxt, 1);
	    xmlXPathValuePush(ctxt, val);
	    return(xmlXPathCompareValues(ctxt, inf, strict));
	default:
            xmlXPathReleaseObject(ctxt->context, arg);
            xmlXPathReleaseObject(ctxt->context, val);
            XP_ERROR0(XPATH_INVALID_TYPE);
    }
    return(0);
}